

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O2

void __thiscall
cmTestGenerator::GenerateScriptNoConfig(cmTestGenerator *this,ostream *os,Indent *indent)

{
  ostream *poVar1;
  string local_30 [32];
  
  cmScriptGeneratorIndent::Write(indent,os);
  poVar1 = std::operator<<(os,"add_test(");
  std::__cxx11::string::string(local_30,(string *)&this->Test->Name);
  poVar1 = std::operator<<(poVar1,local_30);
  std::operator<<(poVar1," NOT_AVAILABLE)\n");
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptNoConfig(std::ostream& os,
                                             Indent const& indent)
{
  os << indent << "add_test(" << this->Test->GetName() << " NOT_AVAILABLE)\n";
}